

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

bool tchecker::zg::shared_is_alu_le(state_t *s1,state_t *s2,map_t *l,map_t *u)

{
  bool bVar1;
  bool bVar2;
  zone_t *this;
  zone_t *zone;
  bool local_58;
  bool local_56;
  undefined1 local_48 [24];
  map_t *local_30;
  map_t *u_local;
  map_t *l_local;
  state_t *s2_local;
  state_t *s1_local;
  
  local_30 = u;
  u_local = l;
  l_local = (map_t *)s2;
  s2_local = s1;
  bVar2 = ta::shared_equal_to(&s1->super_state_t,&s2->super_state_t);
  local_48[0xf] = 0;
  bVar1 = false;
  local_56 = false;
  if (bVar2) {
    state_t::zone_ptr((state_t *)(local_48 + 0x10));
    local_48[0xf] = 1;
    state_t::zone_ptr((state_t *)local_48);
    bVar1 = true;
    bVar2 = tchecker::operator==
                      ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                        *)(local_48 + 0x10),
                       (intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                        *)local_48);
    local_58 = true;
    if (!bVar2) {
      this = state_t::zone(s2_local);
      zone = state_t::zone((state_t *)l_local);
      local_58 = zone_t::is_alu_le(this,zone,u_local,local_30);
    }
    local_56 = local_58;
  }
  s1_local._7_1_ = local_56;
  if (bVar1) {
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                *)local_48);
  }
  if ((local_48[0xf] & 1) != 0) {
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                *)(local_48 + 0x10));
  }
  return (bool)(s1_local._7_1_ & 1);
}

Assistant:

bool shared_is_alu_le(tchecker::zg::state_t const & s1, tchecker::zg::state_t const & s2,
                      tchecker::clockbounds::map_t const & l, tchecker::clockbounds::map_t const & u)
{
  return tchecker::ta::shared_equal_to(s1, s2) && (s1.zone_ptr() == s2.zone_ptr() || s1.zone().is_alu_le(s2.zone(), l, u));
}